

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O2

optional<int> __thiscall ear::Layout::indexForName(Layout *this,string *name)

{
  bool bVar1;
  type tVar2;
  __normal_iterator<const_ear::Channel_*,_std::vector<ear::Channel,_std::allocator<ear::Channel>_>_>
  _Var3;
  long lVar4;
  __normal_iterator<const_ear::Channel_*,_std::vector<ear::Channel,_std::allocator<ear::Channel>_>_>
  __it;
  long lVar5;
  string *local_40;
  Channel *local_38;
  
  __it._M_current =
       (this->_channels).super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_38 = (this->_channels).super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)local_38 - (long)__it._M_current;
  local_40 = name;
  for (lVar4 = lVar5 / 0x90 >> 2; _Var3._M_current = __it._M_current, 0 < lVar4; lVar4 = lVar4 + -1)
  {
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<ear::Layout::indexForName(std::__cxx11::string_const&)const::$_0>::operator()
                      ((_Iter_pred<ear::Layout::indexForName(std::__cxx11::string_const&)const::__0>
                        *)&local_40,__it);
    if (bVar1) goto LAB_00122ce4;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<ear::Layout::indexForName(std::__cxx11::string_const&)const::$_0>::operator()
                      ((_Iter_pred<ear::Layout::indexForName(std::__cxx11::string_const&)const::__0>
                        *)&local_40,__it._M_current + 1);
    _Var3._M_current = __it._M_current + 1;
    if (bVar1) goto LAB_00122ce4;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<ear::Layout::indexForName(std::__cxx11::string_const&)const::$_0>::operator()
                      ((_Iter_pred<ear::Layout::indexForName(std::__cxx11::string_const&)const::__0>
                        *)&local_40,__it._M_current + 2);
    _Var3._M_current = __it._M_current + 2;
    if (bVar1) goto LAB_00122ce4;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<ear::Layout::indexForName(std::__cxx11::string_const&)const::$_0>::operator()
                      ((_Iter_pred<ear::Layout::indexForName(std::__cxx11::string_const&)const::__0>
                        *)&local_40,__it._M_current + 3);
    _Var3._M_current = __it._M_current + 3;
    if (bVar1) goto LAB_00122ce4;
    __it._M_current = __it._M_current + 4;
    lVar5 = lVar5 + -0x240;
  }
  lVar5 = lVar5 / 0x90;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      _Var3._M_current = local_38;
      if ((lVar5 != 3) ||
         (bVar1 = __gnu_cxx::__ops::
                  _Iter_pred<ear::Layout::indexForName(std::__cxx11::string_const&)const::$_0>::
                  operator()((_Iter_pred<ear::Layout::indexForName(std::__cxx11::string_const&)const::__0>
                              *)&local_40,__it), _Var3._M_current = __it._M_current, bVar1))
      goto LAB_00122ce4;
      _Var3._M_current = __it._M_current + 1;
    }
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<ear::Layout::indexForName(std::__cxx11::string_const&)const::$_0>::operator()
                      ((_Iter_pred<ear::Layout::indexForName(std::__cxx11::string_const&)const::__0>
                        *)&local_40,_Var3);
    if (bVar1) goto LAB_00122ce4;
    __it._M_current = _Var3._M_current + 1;
  }
  bVar1 = __gnu_cxx::__ops::
          _Iter_pred<ear::Layout::indexForName(std::__cxx11::string_const&)const::$_0>::operator()
                    ((_Iter_pred<ear::Layout::indexForName(std::__cxx11::string_const&)const::__0> *
                     )&local_40,__it);
  _Var3._M_current = local_38;
  if (bVar1) {
    _Var3._M_current = __it._M_current;
  }
LAB_00122ce4:
  if (_Var3._M_current ==
      (this->_channels).super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    tVar2.m_initialized = false;
    tVar2._1_3_ = 0;
    tVar2.m_storage = 0;
  }
  else {
    tVar2 = (type)((((long)_Var3._M_current -
                    (long)(this->_channels).
                          super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
                          super__Vector_impl_data._M_start) / 0x90 << 0x20) + 1);
  }
  return (optional<int>)tVar2;
}

Assistant:

boost::optional<int> Layout::indexForName(const std::string& name) const {
    auto it = std::find_if(
        _channels.begin(), _channels.end(),
        [&name](const Channel c) -> bool { return c.name() == name; });
    if (it != _channels.end()) {
      return static_cast<int>(std::distance(_channels.begin(), it));
    } else {
      return boost::none;
    }
  }